

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::detail::parse_event<char,_std::allocator<char>_>::replay
          (parse_event<char,_std::allocator<char>_> *this,basic_json_visitor<char> *visitor)

{
  undefined1 *in_RDI;
  ser_context *in_stack_fffffffffffffec0;
  ser_context *in_stack_fffffffffffffec8;
  ser_context *context;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  semantic_tag sVar1;
  string_view_type *in_stack_fffffffffffffed8;
  ser_context *this_00;
  undefined4 in_stack_fffffffffffffee0;
  type_conflict in_stack_fffffffffffffee4;
  ser_context *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef4;
  basic_byte_string<std::allocator<unsigned_char>_> *in_stack_fffffffffffffef8;
  basic_json_visitor<char> *in_stack_ffffffffffffff00;
  ser_context local_78;
  ser_context local_70;
  ser_context local_68;
  ser_context local_60;
  ser_context local_58;
  ser_context local_50;
  ser_context local_48;
  undefined1 local_40 [16];
  ser_context local_30 [3];
  ser_context local_18 [3];
  
  sVar1 = (semantic_tag)((uint)in_stack_fffffffffffffef4 >> 0x18);
  switch(*in_RDI) {
  case 1:
    local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 8));
    sVar1 = (semantic_tag)((uint)in_stack_fffffffffffffed4 >> 0x18);
    local_48._vptr_ser_context = (_func_int **)0x0;
    ser_context::ser_context(&local_48);
    basic_json_visitor<char>::string_value
              ((basic_json_visitor<char> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8,sVar1,in_stack_fffffffffffffec8);
    ser_context::~ser_context(&local_48);
    break;
  case 2:
    local_50._vptr_ser_context = (_func_int **)0x0;
    ser_context::ser_context(&local_50);
    basic_json_visitor<char>::
    byte_string_value<jsoncons::basic_byte_string<std::allocator<unsigned_char>>>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,sVar1,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee4);
    ser_context::~ser_context(&local_50);
    break;
  case 3:
    local_58._vptr_ser_context = (_func_int **)0x0;
    ser_context::ser_context(&local_58);
    basic_json_visitor<char>::null_value
              ((basic_json_visitor<char> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (semantic_tag)((ulong)in_stack_fffffffffffffec8 >> 0x38),in_stack_fffffffffffffec0);
    ser_context::~ser_context(&local_58);
    break;
  case 4:
    local_60._vptr_ser_context = (_func_int **)0x0;
    ser_context::ser_context(&local_60);
    basic_json_visitor<char>::bool_value
              ((basic_json_visitor<char> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0),
               (semantic_tag)((ulong)in_stack_fffffffffffffec8 >> 0x30),in_stack_fffffffffffffec0);
    ser_context::~ser_context(&local_60);
    break;
  case 5:
    context = *(ser_context **)(in_RDI + 0x40);
    sVar1 = none;
    local_68._vptr_ser_context = (_func_int **)0x0;
    this_00 = &local_68;
    ser_context::ser_context(this_00);
    basic_json_visitor<char>::int64_value
              ((basic_json_visitor<char> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),(int64_t)this_00,sVar1,
               context);
    ser_context::~ser_context(&local_68);
    break;
  case 6:
    local_70._vptr_ser_context = (_func_int **)0x0;
    ser_context::ser_context(&local_70);
    basic_json_visitor<char>::uint64_value
              ((basic_json_visitor<char> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (uint64_t)in_stack_fffffffffffffed8,
               (semantic_tag)((uint)in_stack_fffffffffffffed4 >> 0x18),in_stack_fffffffffffffec8);
    ser_context::~ser_context(&local_70);
    break;
  default:
    break;
  case 9:
    local_78._vptr_ser_context = (_func_int **)0x0;
    ser_context::ser_context(&local_78);
    basic_json_visitor<char>::double_value
              ((basic_json_visitor<char> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (double)in_stack_fffffffffffffed8,
               (semantic_tag)((uint)in_stack_fffffffffffffed4 >> 0x18),in_stack_fffffffffffffec8);
    ser_context::~ser_context(&local_78);
    break;
  case 0xe:
    local_18[0]._vptr_ser_context = (_func_int **)0x0;
    ser_context::ser_context(local_18);
    basic_json_visitor<char>::begin_array
              ((basic_json_visitor<char> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (semantic_tag)((ulong)in_stack_fffffffffffffec8 >> 0x38),in_stack_fffffffffffffec0);
    ser_context::~ser_context(local_18);
    break;
  case 0xf:
    local_30[0]._vptr_ser_context = (_func_int **)0x0;
    ser_context::ser_context(local_30);
    basic_json_visitor<char>::end_array
              ((basic_json_visitor<char> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    ser_context::~ser_context(local_30);
  }
  return;
}

Assistant:

void replay(basic_json_visitor<CharT>& visitor) const
        {
            switch (event_type)
            {
                case staj_event_type::begin_array:
                    visitor.begin_array(tag, ser_context());
                    break;
                case staj_event_type::end_array:
                    visitor.end_array(ser_context());
                    break;
                case staj_event_type::string_value:
                    visitor.string_value(string_value, tag, ser_context());
                    break;
                case staj_event_type::byte_string_value:
                    visitor.byte_string_value(byte_string_value, tag, ser_context());
                    break;
                case staj_event_type::null_value:
                    visitor.null_value(tag, ser_context());
                    break;
                case staj_event_type::bool_value:
                    visitor.bool_value(bool_value, tag, ser_context());
                    break;
                case staj_event_type::int64_value:
                    visitor.int64_value(int64_value, tag, ser_context());
                    break;
                case staj_event_type::uint64_value:
                    visitor.uint64_value(uint64_value, tag, ser_context());
                    break;
                case staj_event_type::double_value:
                    visitor.double_value(double_value, tag, ser_context());
                    break;
                default:
                    break;
            }
        }